

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

bool __thiscall
TTD::ExecutionInfoManager::TryGetTopCallCallerCounter
          (ExecutionInfoManager *this,SingleCallCounter *caller)

{
  int iVar1;
  int iVar2;
  SingleCallCounter *__src;
  SingleCallCounter *caller_local;
  ExecutionInfoManager *this_local;
  
  iVar1 = JsUtil::ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>::
          Count(&(this->m_callStack).
                 super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>)
  ;
  if (1 < iVar1) {
    iVar2 = JsUtil::ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>::
            Count(&(this->m_callStack).
                   super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
                 );
    __src = JsUtil::
            List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(&this->m_callStack,iVar2 + -2);
    memcpy(caller,__src,0x48);
  }
  return 1 < iVar1;
}

Assistant:

bool ExecutionInfoManager::TryGetTopCallCallerCounter(SingleCallCounter& caller) const
    {
        if(this->m_callStack.Count() < 2)
        {
            return false;
        }
        else
        {
            caller = this->m_callStack.Item(this->m_callStack.Count() - 2);
            return true;
        }
    }